

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O3

void Kit_DsdVerify(Kit_DsdNtk_t *pNtk,uint *pTruth,int nVars)

{
  long lVar1;
  long lVar2;
  Kit_DsdMan_t *p;
  uint *puVar3;
  ulong uVar4;
  
  p = Kit_DsdManAlloc(nVars,(uint)pNtk->nVars + (uint)pNtk->nNodes + 2);
  puVar3 = Kit_DsdTruthCompute(p,pNtk);
  uVar4 = (ulong)(uint)(1 << ((char)nVars - 5U & 0x1f));
  if (nVars < 6) {
    uVar4 = 1;
  }
  do {
    if ((int)uVar4 < 1) goto LAB_005d2043;
    lVar1 = uVar4 - 1;
    lVar2 = uVar4 - 1;
    uVar4 = uVar4 - 1;
  } while (pTruth[lVar1] == puVar3[lVar2]);
  puts("Verification failed.");
LAB_005d2043:
  Kit_DsdManFree(p);
  return;
}

Assistant:

void Kit_DsdVerify( Kit_DsdNtk_t * pNtk, unsigned * pTruth, int nVars )
{
    Kit_DsdMan_t * p;
    unsigned * pTruthC;
    p = Kit_DsdManAlloc( nVars, Kit_DsdNtkObjNum(pNtk)+2 );
    pTruthC = Kit_DsdTruthCompute( p, pNtk );
    if ( !Extra_TruthIsEqual( pTruth, pTruthC, nVars ) )
        printf( "Verification failed.\n" );
    Kit_DsdManFree( p );
}